

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCGSolver.cpp
# Opt level: O2

void __thiscall amrex::MLCGSolver::MLCGSolver(MLCGSolver *this,MLMG *a_mlmg,MLLinOp *_lp,Type _typ)

{
  this->mlmg = a_mlmg;
  this->Lp = _lp;
  this->solver_type = _typ;
  this->amrlev = 0;
  this->mglev = *(_lp->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + -1;
  this->verbose = 0;
  this->maxiter = 100;
  this->nghost = 0;
  this->iter = -1;
  return;
}

Assistant:

MLCGSolver::MLCGSolver (MLMG* a_mlmg, MLLinOp& _lp, Type _typ)
    : mlmg(a_mlmg),
      Lp(_lp),
      solver_type(_typ),
      amrlev(0),
      mglev(_lp.NMGLevels(0)-1)
{
    amrex::ignore_unused(mlmg);
}